

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep.c
# Opt level: O3

int sprkStep_TakeStep(ARKodeMem ark_mem,sunrealtype *dsmPtr,int *nflagPtr)

{
  double dVar1;
  double dVar2;
  long *plVar3;
  N_Vector p_Var4;
  int iVar5;
  long lVar6;
  N_Vector p_Var7;
  long lVar8;
  double dVar9;
  double local_60;
  
  plVar3 = (long *)ark_mem->step_mem;
  if (plVar3 == (long *)0x0) {
    iVar5 = -0x15;
    arkProcessError(ark_mem,-0x15,0x2e8,"sprkStep_TakeStep",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_sprkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    lVar6 = *plVar3;
    if (0 < *(int *)(lVar6 + 4)) {
      p_Var4 = ark_mem->ycur;
      dVar9 = 0.0;
      lVar8 = 0;
      local_60 = 0.0;
      p_Var7 = ark_mem->yn;
      do {
        dVar1 = *(double *)(*(long *)(lVar6 + 8) + lVar8 * 8);
        dVar2 = *(double *)(*(long *)(lVar6 + 0x10) + lVar8 * 8);
        dVar9 = dVar9 + dVar2;
        *(int *)(plVar3 + 8) = (int)lVar8;
        N_VConst(0,plVar3[2]);
        iVar5 = (*(code *)plVar3[4])
                          (ark_mem->h * dVar9 + ark_mem->tn,p_Var7,plVar3[2],ark_mem->user_data);
        plVar3[6] = plVar3[6] + 1;
        if (iVar5 != 0) {
          return -8;
        }
        local_60 = local_60 + dVar1;
        N_VLinearSum(0x3ff0000000000000,dVar2 * ark_mem->h,p_Var7,plVar3[2],p_Var4);
        ark_mem->tcur = ark_mem->h * dVar9 + ark_mem->tn;
        N_VConst(0,plVar3[2]);
        iVar5 = (*(code *)plVar3[5])
                          (ark_mem->h * local_60 + ark_mem->tn,p_Var4,plVar3[2],ark_mem->user_data);
        plVar3[7] = plVar3[7] + 1;
        if (iVar5 != 0) {
          return -8;
        }
        N_VLinearSum(0x3ff0000000000000,dVar1 * ark_mem->h,p_Var4,plVar3[2],p_Var4);
        if ((ark_mem->ProcessStage != (ARKPostProcessFn)0x0) &&
           (iVar5 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,ark_mem->user_data),
           iVar5 != 0)) {
          return -0x26;
        }
        *(int *)(plVar3 + 8) = (int)plVar3[8] + 1;
        lVar8 = lVar8 + 1;
        lVar6 = *plVar3;
        p_Var7 = p_Var4;
      } while (lVar8 < *(int *)(lVar6 + 4));
    }
    *nflagPtr = 0;
    *dsmPtr = 0.0;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int sprkStep_TakeStep(ARKodeMem ark_mem, sunrealtype* dsmPtr, int* nflagPtr)
{
  ARKodeSPRKStepMem step_mem = NULL;
  N_Vector prev_stage        = NULL;
  N_Vector curr_stage        = NULL;
  sunrealtype ci             = SUN_RCONST(0.0);
  sunrealtype chati          = SUN_RCONST(0.0);
  int is                     = 0;
  int retval                 = 0;

  /* access ARKodeSPRKStepMem structure */
  retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  prev_stage = ark_mem->yn;
  curr_stage = ark_mem->ycur;
  for (is = 0; is < step_mem->method->stages; is++)
  {
    /* load/compute coefficients */
    sunrealtype ai    = step_mem->method->a[is];
    sunrealtype ahati = step_mem->method->ahat[is];

    ci += ai;
    chati += ahati;

    /* store current stage index */
    step_mem->istage = is;

    /* evaluate p' with the previous velocity */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f1(step_mem, ark_mem->tn + chati * ark_mem->h, prev_stage,
                         step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return ARK_RHSFUNC_FAIL; }

    /* position update */
    N_VLinearSum(ONE, prev_stage, ark_mem->h * ahati, step_mem->sdata,
                 curr_stage);

    /* set current stage time(s) */
    ark_mem->tcur = ark_mem->tn + chati * ark_mem->h;

    /* evaluate q' with the current positions */
    N_VConst(ZERO, step_mem->sdata); /* either have to do this or ask user to
                                        set other outputs to zero */
    retval = sprkStep_f2(step_mem, ark_mem->tn + ci * ark_mem->h, curr_stage,
                         step_mem->sdata, ark_mem->user_data);
    if (retval != 0) { return ARK_RHSFUNC_FAIL; }

    /* velocity update */
    N_VLinearSum(ONE, curr_stage, ark_mem->h * ai, step_mem->sdata, curr_stage);

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL)
    {
      retval = ark_mem->ProcessStage(ark_mem->tcur, ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) { return (ARK_POSTPROCESS_STAGE_FAIL); }
    }

    /* keep track of the stage number */
    step_mem->istage++;

    prev_stage = curr_stage;
  }

  *nflagPtr = 0;
  *dsmPtr   = 0;

  return ARK_SUCCESS;
}